

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal_ports.cpp
# Opt level: O2

void __thiscall
sc_core::sc_in<sc_dt::sc_logic>::add_trace_internal
          (sc_in<sc_dt::sc_logic> *this,sc_trace_file *tf_,string *name_)

{
  sc_trace_params_vec *this_00;
  value_type psVar1;
  value_type local_28;
  
  if (tf_ != (sc_trace_file *)0x0) {
    this_00 = this->m_traces;
    if (this_00 == (sc_trace_params_vec *)0x0) {
      this_00 = (sc_trace_params_vec *)operator_new(0x18);
      (this_00->
      super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->
      super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->
      super__Vector_base<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      this->m_traces = this_00;
    }
    psVar1 = (value_type)operator_new(0x28);
    psVar1->tf = tf_;
    std::__cxx11::string::string((string *)&psVar1->name,(string *)name_);
    local_28 = psVar1;
    std::vector<sc_core::sc_trace_params_*,_std::allocator<sc_core::sc_trace_params_*>_>::push_back
              (this_00,&local_28);
  }
  return;
}

Assistant:

void
sc_in<sc_dt::sc_logic>::add_trace_internal( sc_trace_file* tf_,
    const std::string& name_ ) const
{
    if( tf_ != 0 ) {
	if( m_traces == 0 ) {
	    m_traces = new sc_trace_params_vec;
	}
	m_traces->push_back( new sc_trace_params( tf_, name_ ) );
    }
}